

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
* doBuildInputVector(vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *__return_storage_ptr__,
                    vector<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                    *images,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *texts)

{
  pointer *ppvVar1;
  pointer *ppfVar2;
  pointer pvVar3;
  iterator __position;
  pointer pvVar4;
  pointer pbVar5;
  pointer pcVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  pointer pfVar13;
  iterator iVar14;
  long lVar15;
  initializer_list<float> __l;
  vector<float,_std::allocator<float>_> HSI;
  value_type words;
  float local_90;
  float fStack_8c;
  float local_88;
  pointer local_80;
  vector<float,_std::allocator<float>_> local_78;
  ulong local_58;
  double local_50;
  ulong local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  pointer local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = (images->
           super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pvVar3->
               super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
               )._M_impl.super__Vector_impl_data + 8) !=
      (pvVar3->
      super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar15 = 2;
    pfVar13 = (pointer)0x0;
    local_48 = 0;
    local_40 = texts;
    do {
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::_M_realloc_insert<>(__return_storage_ptr__,__position);
      }
      else {
        ((__position._M_current)->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position._M_current)->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppvVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      if ((images->
          super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (images->
          super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        uVar11 = 0;
        local_38 = pfVar13;
        do {
          lVar12 = 0;
          local_58 = uVar11;
          do {
            lVar8 = *(long *)&(images->
                              super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar11].
                              super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data + lVar15;
            local_90 = (float)*(byte *)(lVar12 + -2 + lVar8) / 255.0;
            fStack_8c = (float)*(byte *)(lVar12 + -1 + lVar8) / 255.0;
            local_88 = (float)*(byte *)(lVar12 + lVar8) / 255.0;
            __l._M_len = 3;
            __l._M_array = (iterator)&local_90;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_78,__l,(allocator_type *)&local_50);
            RGB2HSI((vector<float,_std::allocator<float>_> *)&local_90,
                    *local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,
                    *(float *)((long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 4),
                    *(float *)((long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_start + 8));
            pvVar4 = (__return_storage_ptr__->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            local_50 = (double)*(float *)CONCAT44(fStack_8c,local_90) / 6.283185307179586;
            iVar14._M_current =
                 pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<double>
                        (pvVar4 + -1,iVar14,&local_50);
            }
            else {
              *iVar14._M_current = (float)local_50;
              pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            pvVar4 = (__return_storage_ptr__->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pfVar10 = (float *)(CONCAT44(fStack_8c,local_90) + 4);
            iVar14._M_current =
                 pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float&>
                        ((vector<float,std::allocator<float>> *)(pvVar4 + -1),iVar14,pfVar10);
            }
            else {
              *iVar14._M_current = *pfVar10;
              pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            pvVar4 = (__return_storage_ptr__->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pfVar10 = (float *)(CONCAT44(fStack_8c,local_90) + 8);
            iVar14._M_current =
                 pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float&>
                        ((vector<float,std::allocator<float>> *)(pvVar4 + -1),iVar14,pfVar10);
            }
            else {
              *iVar14._M_current = *pfVar10;
              pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
            pvVar7 = (void *)CONCAT44(fStack_8c,local_90);
            if (pvVar7 != (void *)0x0) {
              operator_delete(pvVar7,(long)local_80 - (long)pvVar7);
            }
            if ((pointer *)
                local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer *)0x0) {
              operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            lVar12 = lVar12 + 3;
          } while (lVar12 == 3);
          pbVar5 = (local_40->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          ppfVar2 = &local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          pcVar6 = pbVar5[local_58]._M_dataplus._M_p;
          local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)ppfVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,pcVar6,pcVar6 + pbVar5[local_58]._M_string_length);
          pfVar13 = local_38;
          pvVar4 = (__return_storage_ptr__->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (local_38 <
              local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            local_90 = (float)(int)*(char *)((long)local_78.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                            (long)local_38) / 255.0;
            iVar14._M_current =
                 pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current ==
                pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        (pvVar4 + -1,iVar14,&local_90);
            }
            else {
              *iVar14._M_current = local_90;
LAB_0010ae25:
              pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar14._M_current + 1;
            }
          }
          else {
            local_90 = 0.0;
            iVar14._M_current =
                 pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar14._M_current !=
                pvVar4[-1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar14._M_current = 0.0;
              goto LAB_0010ae25;
            }
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<int>
                      (pvVar4 + -1,iVar14,(int *)&local_90);
          }
          if ((pointer *)
              local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != ppfVar2) {
            operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage + 1);
          }
          uVar11 = local_58 + 1;
          uVar9 = ((long)(images->
                         super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(images->
                         super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        } while (uVar11 <= uVar9 && uVar9 - uVar11 != 0);
      }
      local_48 = local_48 + 2;
      pvVar3 = (images->
               super__Vector_base<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>,_std::allocator<std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pfVar13 = (pointer)((long)pfVar13 + 1);
      uVar11 = ((long)*(pointer *)
                       ((long)&(pvVar3->
                               super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                               )._M_impl.super__Vector_impl_data + 8) -
               *(long *)&(pvVar3->
                         super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                         )._M_impl.super__Vector_impl_data) * -0x5555555555555555;
      lVar15 = lVar15 + 6;
    } while (local_48 <= uVar11 && uVar11 - local_48 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<float>> doBuildInputVector(std::vector<BMPImage> &images, std::vector<std::string> &texts) {
    std::vector<std::vector<float>> input;
    for (int d = 0,t = 0; d < images[0].size(); d+=2, t++) {
        input.emplace_back();
        for (int i = 0; i < images.size(); i++) {
            for (int s = 0; s < 2; s++) {
                float r = images[i][d+s][0];
                float g = images[i][d+s][1];
                float b = images[i][d+s][2];
                auto rgbn = std::vector<float>({r/255, g/255, b/255});
                auto HSI = RGB2HSI(rgbn[0], rgbn[1], rgbn[2]);
                input.back().emplace_back(HSI[0]/(2*M_PI));
                input.back().emplace_back(HSI[1]);
                input.back().emplace_back(HSI[2]);
            }

            auto words = texts[i];
            if (t < words.size()) input.back().emplace_back(float(words[t])/255);
            else input.back().emplace_back(0);
        }
    }
    return input;
}